

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voice.h
# Opt level: O2

void __thiscall Voice::Voice(Voice *this)

{
  allocator_type local_9;
  
  (this->mUpdate)._M_b._M_p = (__pointer_type)0x0;
  this->mStep = 0;
  this->mFlags = 0;
  this->mNumCallbackSamples = 0;
  (this->mDirect).Buffer.mData = (pointer)0x0;
  (this->mDirect).Buffer.mDataEnd = (pointer)0x0;
  this->mSourceID = (__atomic_base<unsigned_int>)0x0;
  this->mPlayState = Stopped;
  (this->mPendingChange)._M_base._M_i = false;
  std::array<Voice::TargetData,_6UL>::array(&this->mSend);
  std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>::vector
            (&this->mChans,2,&local_9);
  return;
}

Assistant:

Voice() = default;